

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O1

void __thiscall
jsonnet::internal::EnforceStringStyle::visit(EnforceStringStyle *this,LiteralString *lit)

{
  long lVar1;
  long lVar2;
  UString *__range2;
  int iVar3;
  int iVar6;
  int iVar7;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar8 [16];
  UString canonical;
  UString local_68;
  UString local_48;
  
  if (2 < lit->tokenKind - BLOCK) {
    if (lit->tokenKind == RAW_DESUGARED) {
      __assert_fail("lit->tokenKind != LiteralString::RAW_DESUGARED",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/formatter.cpp"
                    ,0x292,
                    "virtual void jsonnet::internal::EnforceStringStyle::visit(LiteralString *)");
    }
    jsonnet_string_unescape(&local_68,&(lit->super_AST).location,&lit->value);
    if (local_68._M_string_length == 0) {
      auVar4 = (undefined1  [16])0x0;
      lVar1 = 0;
    }
    else {
      lVar1 = local_68._M_string_length << 2;
      iVar3 = 0;
      iVar6 = 0;
      iVar7 = 0;
      lVar2 = 0;
      do {
        iVar3 = iVar3 + (uint)(*(int *)((long)local_68._M_dataplus._M_p + lVar2) == 0x22);
        iVar6 = iVar6 + (uint)(*(int *)((long)local_68._M_dataplus._M_p + lVar2) == 0x27);
        iVar7 = iVar7 + 1;
        lVar2 = lVar2 + 4;
      } while (lVar1 != lVar2);
      auVar8._0_4_ = -(uint)(iVar3 == 0);
      auVar8._4_4_ = -(uint)(iVar6 == 0);
      auVar8._8_4_ = -(uint)(iVar6 == 0);
      auVar8._12_4_ = -(uint)(iVar7 == 0);
      auVar4._8_4_ = 0xffffffff;
      auVar4._0_8_ = 0xffffffffffffffff;
      auVar4._12_4_ = 0xffffffff;
      auVar4 = auVar4 ^ auVar8;
    }
    auVar5._0_8_ = auVar4._0_8_ << 0x3f;
    auVar5._8_8_ = auVar4._8_8_ << 0x3f;
    iVar3 = movmskpd((int)lVar1,auVar5);
    if (iVar3 != 3) {
      jsonnet_string_escape
                (&local_48,&local_68,
                 (bool)(~((byte)iVar3 >> 1) & (this->super_FmtPass).opts.stringStyle == 's' |
                       (byte)iVar3 & 1));
      visit();
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity * 4 + 4);
    }
  }
  return;
}

Assistant:

void visit(LiteralString *lit)
    {
        assert(lit->tokenKind != LiteralString::RAW_DESUGARED);
        if (lit->tokenKind == LiteralString::BLOCK)
            return;
        if (lit->tokenKind == LiteralString::VERBATIM_DOUBLE)
            return;
        if (lit->tokenKind == LiteralString::VERBATIM_SINGLE)
            return;
        UString canonical = jsonnet_string_unescape(lit->location, lit->value);
        unsigned num_single = 0, num_double = 0;
        for (char32_t c : canonical) {
            if (c == '\'')
                num_single++;
            if (c == '"')
                num_double++;
        }
        if (num_single > 0 && num_double > 0)
            return;  // Don't change it.
        bool use_single = opts.stringStyle == 's';
        if (num_single > 0)
            use_single = false;
        if (num_double > 0)
            use_single = true;

        // Change it.
        lit->value = jsonnet_string_escape(canonical, use_single);
        lit->tokenKind = use_single ? LiteralString::SINGLE : LiteralString::DOUBLE;
    }